

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.hpp
# Opt level: O3

void __thiscall glu::StructMember::StructMember(StructMember *this,char *name,VarType *type)

{
  allocator<char> local_11;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)this,name,&local_11);
  (this->m_type).m_type = TYPE_LAST;
  (this->m_type).m_data.array.elementType = (VarType *)0x0;
  (this->m_type).m_data.array.size = 0;
  VarType::operator=(&this->m_type,type);
  return;
}

Assistant:

StructMember	(const char* name, const VarType& type) : m_name(name), m_type(type) {}